

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall buffer::reserve(buffer *this,int count)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int local_20;
  int capacity;
  int bias;
  int used;
  int count_local;
  buffer *this_local;
  
  if ((long)(this->buffer_ + ((long)this->capacity_ - (long)this->begin_)) <= (long)count) {
    iVar1 = (int)this->end_ - (int)this->begin_;
    iVar2 = (int)this->begin_ - (int)this->buffer_;
    bias = count;
    _used = this;
    piVar3 = std::max<int>(&bias,&this->init_size_);
    bias = *piVar3;
    piVar3 = std::max<int>(&min_buffer_size,&this->capacity_);
    for (local_20 = *piVar3; local_20 < bias; local_20 = local_20 << 1) {
    }
    if (this->capacity_ < local_20) {
      pcVar4 = (char *)realloc(this->buffer_,(long)local_20);
      this->buffer_ = pcVar4;
      this->capacity_ = local_20;
    }
    if ((0 < iVar1) && (0 < iVar2)) {
      memmove(this->buffer_,this->buffer_ + iVar2,(long)iVar1);
    }
    this->begin_ = this->buffer_;
    this->end_ = this->begin_ + iVar1;
  }
  return;
}

Assistant:

void buffer::reserve(int count)
{
    if (buffer_ + capacity_ - begin_ > count)
    {
        return;
    }

    int used = end_ - begin_;
    int bias = begin_ - buffer_; 

    count = std::max<int>(count, init_size_);
    int capacity = std::max<int>(min_buffer_size, capacity_);
    while (capacity < count) capacity *= 2;
        
    if (capacity_ < capacity)
    {
        buffer_ = (char*)realloc(buffer_, capacity);
        capacity_ = capacity;
    }

    if (used > 0 && bias > 0)
    {
        memmove(buffer_, buffer_ + bias, used);
    }

    begin_ = buffer_;
    end_ = begin_ + used;
}